

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

bool Search::might_print_update(vw *all)

{
  long *in_RDI;
  double dVar1;
  undefined1 local_9;
  
  dVar1 = shared_data::weighted_examples((shared_data *)*in_RDI);
  local_9 = 0;
  if (((double)*(float *)(*in_RDI + 0x50) <= dVar1 + 1.0) &&
     (local_9 = 0, (*(byte *)((long)in_RDI + 0x3439) & 1) == 0)) {
    local_9 = *(byte *)((long)in_RDI + 0x9c) ^ 0xff;
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool might_print_update(vw& all)
{
  // basically do should_print_update but check me and the next
  // example because of off-by-ones

  if (PRINT_UPDATE_EVERY_EXAMPLE)
    return true;
  if (PRINT_UPDATE_EVERY_PASS)
    return true;  // SPEEDUP: make this better
  return (all.sd->weighted_examples() + 1. >= all.sd->dump_interval) && !all.quiet && !all.bfgs;
}